

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorodBuilderCmd.cpp
# Opt level: O3

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  iVar5 = 0;
  if (args_info->output_given == 0) {
    pcVar4 = "";
    if (additional_error != (char *)0x0) {
      pcVar4 = additional_error;
    }
    fprintf(_stderr,"%s: \'--output\' (\'-o\') option required%s\n",prog_name,pcVar4);
    iVar5 = 1;
  }
  if (args_info->latticeConstant_given == 0) {
    pcVar4 = "";
    if (additional_error != (char *)0x0) {
      pcVar4 = additional_error;
    }
    fprintf(_stderr,"%s: \'--latticeConstant\' option required%s\n",prog_name,pcVar4);
    iVar5 = 1;
  }
  if (args_info->radius_given == 0) {
    pcVar4 = "";
    if (additional_error != (char *)0x0) {
      pcVar4 = additional_error;
    }
    fprintf(_stderr,"%s: \'--radius\' option required%s\n",prog_name,pcVar4);
    iVar5 = 1;
  }
  if (args_info->length_given == 0) {
    pcVar4 = "";
    if (additional_error != (char *)0x0) {
      pcVar4 = additional_error;
    }
    fprintf(_stderr,"%s: \'--length\' option required%s\n",prog_name,pcVar4);
    iVar5 = 1;
  }
  iVar1 = check_multiple_option_occurrences
                    (prog_name,args_info->shellRadius_given,args_info->shellRadius_min,
                     args_info->shellRadius_max,"\'--shellRadius\'");
  iVar2 = check_multiple_option_occurrences
                    (prog_name,args_info->molFraction_given,args_info->molFraction_min,
                     args_info->molFraction_max,"\'--molFraction\'");
  iVar3 = 1;
  if (iVar2 == 0 && iVar1 == 0) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->output_given)
    {
      fprintf (stderr, "%s: '--output' ('-o') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->latticeConstant_given)
    {
      fprintf (stderr, "%s: '--latticeConstant' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->radius_given)
    {
      fprintf (stderr, "%s: '--radius' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->length_given)
    {
      fprintf (stderr, "%s: '--length' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (check_multiple_option_occurrences(prog_name, args_info->shellRadius_given, args_info->shellRadius_min, args_info->shellRadius_max, "'--shellRadius'"))
     error_occurred = 1;
  
  if (check_multiple_option_occurrences(prog_name, args_info->molFraction_given, args_info->molFraction_min, args_info->molFraction_max, "'--molFraction'"))
     error_occurred = 1;
  
  
  /* checks for dependences among options */

  return error_occurred;
}